

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::ui_render_main(Application *this)

{
  Application *in_RDI;
  shared_ptr<PathTracerThread> *unaff_retaddr;
  shared_ptr<Lighting> *in_stack_00000018;
  shared_ptr<PathTracerThread> *in_stack_00000020;
  shared_ptr<PathTracerThread> *in_stack_000000f0;
  ImGuiPopupFlags in_stack_ffffffffffffffec;
  
  if (in_RDI->m_ui_state == kLoading) {
    ImGui::OpenPopup((char *)in_RDI,in_stack_ffffffffffffffec);
    UI::LoaderLoadingModal((shared_ptr<LoaderThread> *)in_RDI);
  }
  ui_menubar(in_RDI);
  UI::LoaderLoadSceneModal((shared_ptr<LoaderThread> *)this);
  UI::PathTracerStartModal(in_stack_00000020);
  UI::PathTracerStopModal(unaff_retaddr);
  UI::PathTracerExportEXRModal(in_stack_000000f0);
  UI::LightingLoadEnvMapModal((shared_ptr<myvk::CommandPool> *)in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void Application::ui_render_main() {
	if (m_ui_state == UIStates::kLoading) {
		ImGui::OpenPopup(UI::kLoaderLoadingModal);
		UI::LoaderLoadingModal(m_loader_thread);
	}
	ui_menubar();

	UI::LoaderLoadSceneModal(m_loader_thread);
	UI::PathTracerStartModal(m_path_tracer_thread);
	UI::PathTracerStopModal(m_path_tracer_thread);
	UI::PathTracerExportEXRModal(m_path_tracer_thread);
	UI::LightingLoadEnvMapModal(m_main_command_pool, m_lighting);
}